

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ScaleLayerParams::ScaleLayerParams
          (ScaleLayerParams *this,ScaleLayerParams *from)

{
  void *pvVar1;
  WeightParams *pWVar2;
  WeightParams *pWVar3;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ScaleLayerParams_00768230;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField
            (&this->shapescale_,&from->shapescale_);
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField(&this->shapebias_,&from->shapebias_)
  ;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  pWVar2 = from->scale_;
  if (pWVar2 == (WeightParams *)0x0 ||
      from == (ScaleLayerParams *)&_ScaleLayerParams_default_instance_) {
    pWVar3 = (WeightParams *)0x0;
  }
  else {
    pWVar3 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar3,pWVar2);
  }
  this->scale_ = pWVar3;
  pWVar2 = from->bias_;
  if (pWVar2 == (WeightParams *)0x0 ||
      from == (ScaleLayerParams *)&_ScaleLayerParams_default_instance_) {
    pWVar3 = (WeightParams *)0x0;
  }
  else {
    pWVar3 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar3,pWVar2);
  }
  this->bias_ = pWVar3;
  this->hasbias_ = from->hasbias_;
  return;
}

Assistant:

ScaleLayerParams::ScaleLayerParams(const ScaleLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      shapescale_(from.shapescale_),
      shapebias_(from.shapebias_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_scale()) {
    scale_ = new ::CoreML::Specification::WeightParams(*from.scale_);
  } else {
    scale_ = NULL;
  }
  if (from.has_bias()) {
    bias_ = new ::CoreML::Specification::WeightParams(*from.bias_);
  } else {
    bias_ = NULL;
  }
  hasbias_ = from.hasbias_;
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ScaleLayerParams)
}